

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool q_evaluateRhiConfigRecursive
               (QWidget *w,QPlatformBackingStoreRhiConfig *outConfig,SurfaceType *outType)

{
  bool bVar1;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  QWidgetPrivate *pQVar5;
  QObjectList *outType_00;
  const_iterator o;
  QWidget *this;
  bool extraout_DL;
  QPlatformBackingStoreRhiConfig *in_RDX;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QWidget *childWidget;
  QObject *child;
  QObjectList *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QPlatformBackingStoreRhiConfig config;
  QObject *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  WidgetAttribute in_stack_ffffffffffffff84;
  bool local_41;
  const_iterator local_30;
  undefined1 *local_28;
  undefined1 local_20;
  QPlatformBackingStoreRhiConfig local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18.m_debugLayer = true;
  local_18._9_3_ = 0xaaaaaa;
  pQVar5 = QWidgetPrivate::get((QWidget *)0x35f298);
  local_28 = (undefined1 *)(**(code **)(*(long *)pQVar5 + 0x40))();
  local_18.m_debugLayer = extraout_DL;
  local_20 = extraout_DL;
  local_18._0_8_ = local_28;
  bVar1 = QPlatformBackingStoreRhiConfig::isEnabled(&local_18);
  if (bVar1) {
    if (in_RSI != (QWidget *)0x0) {
      in_RSI->super_QObject = (QObject)local_18.m_enable;
      *(undefined3 *)&in_RSI->field_0x1 = local_18._1_3_;
      *(Api *)&in_RSI->field_0x4 = local_18.m_api;
      in_RSI->field_0x8 = local_18.m_debugLayer;
    }
    if (in_RDX != (QPlatformBackingStoreRhiConfig *)0x0) {
      uVar3 = QBackingStoreRhiSupport::surfaceTypeForConfig
                        ((QPlatformBackingStoreRhiConfig *)&local_18);
      *(undefined4 *)in_RDX = uVar3;
    }
    local_41 = true;
  }
  else {
    outType_00 = QObject::children((QObject *)0x35f329);
    local_30.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QObject_*>::begin
                         ((QList<QObject_*> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    o = QList<QObject_*>::end
                  ((QList<QObject_*> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                  );
    while (bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_30,o), bVar1) {
      QList<QObject_*>::const_iterator::operator*(&local_30);
      this = qobject_cast<QWidget_const*>(in_stack_ffffffffffffff78);
      if ((this != (QWidget *)0x0) &&
         (bVar1 = q_evaluateRhiConfigRecursive(in_RSI,in_RDX,(SurfaceType *)outType_00), bVar1)) {
        if ((q_evaluateRhiConfigRecursive(QWidget_const*,QPlatformBackingStoreRhiConfig*,QSurface::SurfaceType*)
             ::optOut == '\0') &&
           (iVar4 = __cxa_guard_acquire(&q_evaluateRhiConfigRecursive(QWidget_const*,QPlatformBackingStoreRhiConfig*,QSurface::SurfaceType*)
                                         ::optOut), iVar4 != 0)) {
          bVar2 = qEnvironmentVariableIsSet("QT_WIDGETS_NO_CHILD_RHI");
          q_evaluateRhiConfigRecursive::optOut = (bool)(bVar2 & 1);
          __cxa_guard_release(&q_evaluateRhiConfigRecursive(QWidget_const*,QPlatformBackingStoreRhiConfig*,QSurface::SurfaceType*)
                               ::optOut);
        }
        if (((q_evaluateRhiConfigRecursive::optOut & 1U) != 0) ||
           (bVar1 = QWidget::testAttribute(this,in_stack_ffffffffffffff84), !bVar1)) {
          local_41 = true;
          goto LAB_0035f442;
        }
      }
      QList<QObject_*>::const_iterator::operator++(&local_30);
    }
    local_41 = false;
  }
LAB_0035f442:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

static bool q_evaluateRhiConfigRecursive(const QWidget *w, QPlatformBackingStoreRhiConfig *outConfig, QSurface::SurfaceType *outType)
{
    QPlatformBackingStoreRhiConfig config = QWidgetPrivate::get(w)->rhiConfig();
    if (config.isEnabled()) {
        if (outConfig)
            *outConfig = config;
        if (outType)
            *outType = QBackingStoreRhiSupport::surfaceTypeForConfig(config);
        return true;
    }
    for (const QObject *child : w->children()) {
        if (const QWidget *childWidget = qobject_cast<const QWidget *>(child)) {
            if (q_evaluateRhiConfigRecursive(childWidget, outConfig, outType)) {
                static bool optOut = qEnvironmentVariableIsSet("QT_WIDGETS_NO_CHILD_RHI");
                // Native child widgets should not trigger RHI for its parent
                // hierarchy, but will still flush the native child using RHI.
                if (!optOut && childWidget->testAttribute(Qt::WA_NativeWindow))
                    continue;

                return true;
            }
        }
    }
    return false;
}